

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

uv_signal_t * uv__signal_first_handle(int signum)

{
  uv_signal_t *handle;
  uv_signal_t lookup;
  uv_signal_s *puStack_10;
  int signum_local;
  
  lookup.next_closing._0_4_ = 0;
  lookup.data = (void *)0x0;
  lookup.signal_cb._0_4_ = signum;
  lookup.dispatched_signals = signum;
  puStack_10 = uv__signal_tree_s_RB_NFIND(&uv__signal_tree,(uv_signal_s *)&handle);
  if ((puStack_10 == (uv_signal_s *)0x0) || (puStack_10->signum != lookup.dispatched_signals)) {
    puStack_10 = (uv_signal_s *)0x0;
  }
  return puStack_10;
}

Assistant:

static uv_signal_t* uv__signal_first_handle(int signum) {
  /* This function must be called with the signal lock held. */
  uv_signal_t lookup;
  uv_signal_t* handle;

  lookup.signum = signum;
  lookup.flags = 0;
  lookup.loop = NULL;

  handle = RB_NFIND(uv__signal_tree_s, &uv__signal_tree, &lookup);

  if (handle != NULL && handle->signum == signum)
    return handle;

  return NULL;
}